

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Fad<double> *pFVar4;
  double *pdVar5;
  Fad<double> *pFVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  double *pdVar10;
  double *pdVar11;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar12;
  
  pFVar12 = (fadexpr->fadexpr_).left_;
  pFVar6 = (pFVar12->fadexpr_).left_;
  uVar7 = (pFVar6->dx_).num_elts;
  uVar1 = (((pFVar12->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar1 < (int)uVar7) {
    uVar1 = uVar7;
  }
  uVar2 = (this->dx_).num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 == 0) goto LAB_00dc534b;
    pdVar5 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
          pFVar12 = (fadexpr->fadexpr_).left_;
          pFVar6 = (pFVar12->fadexpr_).left_;
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00dc534b;
    }
    if (uVar2 != 0) {
      pdVar5 = (this->dx_).ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
        pFVar12 = (fadexpr->fadexpr_).left_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar1;
    uVar8 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar8 = (ulong)uVar1 << 3;
    }
    pdVar5 = (double *)operator_new__(uVar8);
    (this->dx_).ptr_to_data = pdVar5;
    pFVar6 = (pFVar12->fadexpr_).left_;
    uVar7 = (pFVar6->dx_).num_elts;
  }
  if ((uVar7 == 0) || (pFVar4 = (pFVar12->fadexpr_).right_, (pFVar4->dx_).num_elts == 0)) {
    if (0 < (int)uVar1) {
      pFVar4 = (pFVar12->fadexpr_).right_;
      iVar3 = (pFVar4->dx_).num_elts;
      uVar8 = (ulong)uVar1;
      lVar9 = 0;
      do {
        pdVar10 = (double *)((long)(pFVar6->dx_).ptr_to_data + lVar9);
        if (uVar7 == 0) {
          pdVar10 = &pFVar6->defaultVal;
        }
        pdVar11 = (double *)((long)(pFVar4->dx_).ptr_to_data + lVar9);
        if (iVar3 == 0) {
          pdVar11 = &pFVar4->defaultVal;
        }
        *(double *)((long)pdVar5 + lVar9) =
             (*pdVar10 * pFVar4->val_ + *pdVar11 * pFVar6->val_) *
             (fadexpr->fadexpr_).right_.constant_;
        lVar9 = lVar9 + 8;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
  }
  else if (0 < (int)uVar1) {
    pdVar10 = (pFVar6->dx_).ptr_to_data;
    pdVar11 = (pFVar4->dx_).ptr_to_data;
    uVar8 = 0;
    do {
      pdVar5[uVar8] =
           (pdVar10[uVar8] * pFVar4->val_ + pdVar11[uVar8] * pFVar6->val_) *
           (fadexpr->fadexpr_).right_.constant_;
      uVar8 = uVar8 + 1;
    } while (uVar1 != uVar8);
  }
LAB_00dc534b:
  this->val_ = pFVar6->val_ * ((pFVar12->fadexpr_).right_)->val_ *
               (fadexpr->fadexpr_).right_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}